

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reply_deferrable.c
# Opt level: O1

mpt_metatype *
mpt_reply_deferrable
          (size_t len,_func_int_void_ptr_mpt_reply_data_ptr_mpt_message_ptr *send,void *ptr)

{
  undefined8 *puVar1;
  mpt_metatype *pmVar2;
  mpt_metatype *pmVar3;
  
  if (len < 0x10000) {
    pmVar3 = (mpt_metatype *)0x0;
    pmVar2 = (mpt_metatype *)(len - 4);
    if (len < 4) {
      pmVar2 = pmVar3;
    }
    puVar1 = (undefined8 *)malloc((size_t)(pmVar2 + 6));
    if (puVar1 != (undefined8 *)0x0) {
      *puVar1 = send;
      puVar1[1] = ptr;
      puVar1[2] = 1;
      pmVar3 = (mpt_metatype *)(puVar1 + 3);
      puVar1[3] = &mpt_reply_deferrable::replyMeta;
      puVar1[4] = &mpt_reply_deferrable::replyCtx;
      *(short *)(puVar1 + 5) = (short)len;
      *(undefined2 *)((long)puVar1 + 0x2a) = 0;
    }
  }
  else {
    pmVar3 = (mpt_metatype *)0x0;
  }
  return pmVar3;
}

Assistant:

extern MPT_INTERFACE(metatype) *mpt_reply_deferrable(size_t len, int (*send)(void *, const MPT_STRUCT(reply_data) *, const MPT_STRUCT(message) *), void *ptr)
{
	static const MPT_INTERFACE_VPTR(metatype) replyMeta = {
		{ contextConv },
		contextUnref,
		contextRef,
		contextClone
	};
	static const MPT_INTERFACE_VPTR(reply_context) replyCtx = {
		contextSet,
		contextDefer
	};
	MPT_STRUCT(reply_context_defer) *ctx;
	size_t post;
	
	if (len > UINT16_MAX) {
		return 0;
	}
	post = len > sizeof(ctx->data.val) ? len - sizeof(ctx->data.val) : 0;
	if (!(ctx = malloc(sizeof(*ctx) + post))) {
		return 0;
	}
	ctx->reply.send = send;
	ctx->reply.ptr  = ptr;
	
	ctx->ref._val = 1;
	
	ctx->_mt._vptr = &replyMeta;
	ctx->_ctx._vptr = &replyCtx;
	
	ctx->data._max = len;
	ctx->data.len = 0;
	
	return &ctx->_mt;
}